

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::getEnterVals
          (SPxSolverBase<double> *this,SPxId enterId,double *enterTest,double *enterUB,
          double *enterLB,double *enterVal,double *enterMax,double *enterPric,Status *enterStat,
          double *enterRO,StableSum<double> *objChange)

{
  double dVar1;
  int iVar2;
  Status SVar3;
  ulong *puVar4;
  double *pdVar5;
  double *pdVar6;
  Status *pSVar7;
  pointer pdVar8;
  SPxInternalCodeException *pSVar9;
  long lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  allocator local_89;
  double *local_88;
  undefined8 uStack_80;
  SPxId enterId_local;
  string local_68;
  double local_48;
  undefined8 uStack_40;
  
  local_88 = enterVal;
  enterId_local = enterId;
  if (enterId.super_DataKey.info < 1) {
    SPxRowId::SPxRowId((SPxRowId *)&local_68,&enterId_local);
    iVar2 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set,(DataKey *)&local_68);
    lVar10 = (long)iVar2;
    SVar3 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar10];
    *enterStat = SVar3;
    if (this->theRep == ROW) {
      computePvec(this,iVar2);
      dVar1 = computeTest(this,iVar2);
      *enterTest = dVar1;
      (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10] = 0.0;
      SVar3 = *enterStat;
    }
    else {
      pdVar8 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      *enterTest = pdVar8[lVar10];
      pdVar8[lVar10] = 0.0;
    }
    switch(SVar3) {
    case D_FREE:
      pdVar5 = (double *)infinity();
      *enterUB = *pdVar5;
      pdVar5 = (double *)infinity();
      *enterLB = -*pdVar5;
      *local_88 = 0.0;
      *enterPric = (this->thePvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
      dVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10];
      *enterRO = dVar1;
      local_88 = (double *)-(ulong)(dVar1 < *enterPric);
      uStack_80 = 0;
      puVar4 = (ulong *)infinity();
      *enterMax = (double)((ulong)local_88 & *puVar4 |
                          ~(ulong)local_88 & (*puVar4 ^ 0x8000000000000000));
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      goto LAB_001c2c8f;
    case D_ON_UPPER:
      *enterUB = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      pdVar6 = (double *)infinity();
      pdVar5 = local_88;
      *enterLB = -*pdVar6;
      *local_88 = *enterUB;
      pdVar6 = (double *)infinity();
      *enterMax = -*pdVar6;
      *enterPric = (this->thePvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
      dVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10];
      *enterRO = dVar1;
      StableSum<double>::operator-=(objChange,dVar1 * *pdVar5);
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      goto LAB_001c2f47;
    case D_ON_LOWER:
      *enterLB = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      pdVar6 = (double *)infinity();
      pdVar5 = local_88;
      *enterUB = *pdVar6;
      *local_88 = *enterLB;
      pdVar6 = (double *)infinity();
      *enterMax = *pdVar6;
      *enterPric = (this->thePvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
      dVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10];
      *enterRO = dVar1;
      StableSum<double>::operator-=(objChange,dVar1 * *pdVar5);
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      goto LAB_001c2e17;
    case D_ON_BOTH:
      dVar1 = (this->thePvec->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10];
      *enterPric = dVar1;
      pdVar5 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar10;
      if (dVar1 < *pdVar5 || dVar1 == *pdVar5) {
        dVar1 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        *enterUB = dVar1;
        *local_88 = dVar1;
        pdVar5 = (double *)infinity();
        *enterLB = -*pdVar5;
        pdVar5 = (double *)infinity();
        *enterMax = -*pdVar5;
        dVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar10];
        uVar11 = SUB84(dVar1,0);
        uVar12 = (undefined4)((ulong)dVar1 >> 0x20);
        (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar10] = P_ON_LOWER;
        pdVar8 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      }
      else {
        dVar1 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        *enterLB = dVar1;
        *local_88 = dVar1;
        pdVar5 = (double *)infinity();
        *enterUB = *pdVar5;
        pdVar5 = (double *)infinity();
        *enterMax = *pdVar5;
        pdVar8 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar11 = SUB84(pdVar8[lVar10],0);
        uVar12 = (undefined4)((ulong)pdVar8[lVar10] >> 0x20);
        (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar10] = P_ON_UPPER;
      }
      *enterRO = (double)CONCAT44(uVar12,uVar11);
      StableSum<double>::operator-=
                (objChange,
                 (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10] * pdVar8[lVar10]);
      dVar1 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10];
      uVar11 = SUB84(dVar1,0);
      uVar12 = (undefined4)((ulong)dVar1 >> 0x20);
      pdVar8 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      goto LAB_001c30c7;
    case P_ON_LOWER:
      *enterUB = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      *enterLB = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      dVar1 = *enterUB;
      *local_88 = dVar1;
      *enterMax = *enterLB - dVar1;
      *enterPric = (this->theCoPvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
      dVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10];
      *enterRO = dVar1;
      StableSum<double>::operator-=(objChange,dVar1 * *local_88);
      local_88 = (double *)*enterLB;
      pdVar5 = (double *)infinity();
      if ((double)local_88 <= -*pdVar5) {
        pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
        goto LAB_001c27a3;
      }
      break;
    default:
      pSVar9 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_68,"XENTER03 This should never happen.",&local_89);
      SPxInternalCodeException::SPxInternalCodeException(pSVar9,&local_68);
      __cxa_throw(pSVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_UPPER:
      *enterUB = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      dVar1 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10];
      *enterLB = dVar1;
      *local_88 = dVar1;
      *enterMax = *enterUB - *enterLB;
      *enterPric = (this->theCoPvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
      dVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10];
      *enterRO = dVar1;
      StableSum<double>::operator-=(objChange,dVar1 * *local_88);
      local_88 = (double *)*enterUB;
      pdVar5 = (double *)infinity();
      if (*pdVar5 <= (double)local_88) {
        pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
        goto LAB_001c3016;
      }
      break;
    case P_FREE:
      pSVar9 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_68,"XENTER02 This should never happen.",&local_89);
      SPxInternalCodeException::SPxInternalCodeException(pSVar9,&local_68);
      __cxa_throw(pSVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    local_88 = (double *)(*enterLB - *enterUB);
    uStack_80 = 0;
    dVar1 = epsilon(this);
    pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
    if (ABS((double)local_88) <= dVar1) goto LAB_001c2d7b;
  }
  else {
    SPxColId::SPxColId((SPxColId *)&local_68,&enterId_local);
    iVar2 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                        super_SVSetBase<double>.set,(DataKey *)&local_68);
    lVar10 = (long)iVar2;
    SVar3 = (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar10];
    *enterStat = SVar3;
    if (this->theRep == COLUMN) {
      computePvec(this,iVar2);
      dVar1 = computeTest(this,iVar2);
      *enterTest = dVar1;
      (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10] = 0.0;
      SVar3 = *enterStat;
    }
    else {
      pdVar8 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      *enterTest = pdVar8[lVar10];
      pdVar8[lVar10] = 0.0;
    }
    switch(SVar3) {
    case D_FREE:
      pdVar5 = (double *)infinity();
      *enterUB = *pdVar5;
      pdVar5 = (double *)infinity();
      *enterLB = -*pdVar5;
      *local_88 = 0.0;
      *enterRO = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar10];
      local_88 = (double *)
                 (this->theCoPvec->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar10];
      *enterPric = (double)local_88;
      local_48 = *enterRO;
      uStack_40 = 0;
      puVar4 = (ulong *)infinity();
      *enterMax = (double)(-(ulong)(local_48 < (double)local_88) & *puVar4 |
                          ~-(ulong)(local_48 < (double)local_88) & (*puVar4 ^ 0x8000000000000000));
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001c2c8f:
      pSVar7[lVar10] = P_FIXED;
      return;
    case D_ON_UPPER:
      *enterUB = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      pdVar5 = (double *)infinity();
      *enterLB = -*pdVar5;
      pdVar5 = (double *)infinity();
      *enterMax = -*pdVar5;
      *local_88 = *enterUB;
      *enterPric = (this->theCoPvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
      dVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10];
      *enterRO = dVar1;
      StableSum<double>::operator-=(objChange,dVar1 * *local_88);
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001c2f47:
      pSVar7[lVar10] = P_ON_LOWER;
      return;
    case D_ON_LOWER:
      *enterLB = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      pdVar5 = (double *)infinity();
      *enterUB = *pdVar5;
      pdVar5 = (double *)infinity();
      *enterMax = *pdVar5;
      *local_88 = *enterLB;
      *enterPric = (this->theCoPvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
      dVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10];
      *enterRO = dVar1;
      StableSum<double>::operator-=(objChange,dVar1 * *local_88);
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001c2e17:
      pSVar7[lVar10] = P_ON_UPPER;
      return;
    case D_ON_BOTH:
      dVar1 = (this->theCoPvec->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10];
      *enterPric = dVar1;
      pdVar5 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar10;
      if (dVar1 < *pdVar5 || dVar1 == *pdVar5) {
        dVar1 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        *enterUB = dVar1;
        *local_88 = dVar1;
        *enterRO = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
        pdVar5 = (double *)infinity();
        *enterLB = -*pdVar5;
        pdVar5 = (double *)infinity();
        *enterMax = -*pdVar5;
        (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar10] = P_ON_LOWER;
        dVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar10];
        uVar11 = SUB84(dVar1,0);
        uVar12 = (undefined4)((ulong)dVar1 >> 0x20);
      }
      else {
        *enterLB = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar10];
        pdVar5 = (double *)infinity();
        *enterUB = *pdVar5;
        pdVar5 = (double *)infinity();
        *enterMax = *pdVar5;
        *local_88 = *enterLB;
        dVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar10];
        uVar11 = SUB84(dVar1,0);
        uVar12 = (undefined4)((ulong)dVar1 >> 0x20);
        *enterRO = dVar1;
        (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar10] = P_ON_UPPER;
      }
      StableSum<double>::operator-=
                (objChange,
                 (double)CONCAT44(uVar12,uVar11) *
                 (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10]);
      dVar1 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10];
      uVar11 = SUB84(dVar1,0);
      uVar12 = (undefined4)((ulong)dVar1 >> 0x20);
      pdVar8 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
LAB_001c30c7:
      StableSum<double>::operator-=(objChange,(double)CONCAT44(uVar12,uVar11) * pdVar8[lVar10]);
      return;
    case P_ON_LOWER:
      *enterUB = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      dVar1 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10];
      *enterLB = dVar1;
      *local_88 = dVar1;
      *enterMax = *enterUB - *enterLB;
      *enterPric = (this->thePvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
      dVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10];
      *enterRO = dVar1;
      StableSum<double>::operator-=(objChange,dVar1 * *local_88);
      local_88 = (double *)*enterUB;
      pdVar5 = (double *)infinity();
      if (*pdVar5 <= (double)local_88) {
        pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001c27a3:
        pSVar7[lVar10] = D_ON_UPPER;
        return;
      }
      break;
    default:
      pSVar9 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_68,"XENTER01 This should never happen.",&local_89);
      SPxInternalCodeException::SPxInternalCodeException(pSVar9,&local_68);
      __cxa_throw(pSVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_UPPER:
      *enterUB = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      *enterLB = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      dVar1 = *enterUB;
      *local_88 = dVar1;
      *enterMax = *enterLB - dVar1;
      *enterPric = (this->thePvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
      dVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10];
      *enterRO = dVar1;
      StableSum<double>::operator-=(objChange,dVar1 * *local_88);
      local_88 = (double *)*enterLB;
      pdVar5 = (double *)infinity();
      if ((double)local_88 <= -*pdVar5) {
        pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001c3016:
        pSVar7[lVar10] = D_ON_LOWER;
        return;
      }
      break;
    case P_FREE:
      *enterUB = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      *enterLB = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      *local_88 = 0.0;
      *enterPric = (this->thePvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
      local_88 = (double *)
                 (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar10];
      *enterRO = (double)local_88;
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar10] = D_UNDEFINED;
      local_48 = *enterPric;
      uStack_40 = 0;
      puVar4 = (ulong *)infinity();
      *enterMax = (double)(~-(ulong)(local_48 < (double)local_88) & (*puVar4 ^ 0x8000000000000000) |
                          *puVar4 & -(ulong)(local_48 < (double)local_88));
      return;
    }
    local_88 = (double *)(*enterLB - *enterUB);
    uStack_80 = 0;
    dVar1 = epsilon(this);
    pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
    if (ABS((double)local_88) <= dVar1) {
LAB_001c2d7b:
      pSVar7[lVar10] = D_FREE;
      return;
    }
  }
  pSVar7[lVar10] = D_ON_BOTH;
  return;
}

Assistant:

void SPxSolverBase<R>::getEnterVals
(
   SPxId enterId,
   R& enterTest,
   R& enterUB,
   R& enterLB,
   R& enterVal,
   R& enterMax,
   R& enterPric,
   typename SPxBasisBase<R>::Desc::Status& enterStat,
   R& enterRO,
   StableSum<R>& objChange
)
{
   int enterIdx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(enterId.isSPxColId())
   {
      enterIdx = this->number(SPxColId(enterId));
      enterStat = ds.colStatus(enterIdx);
      assert(!isBasic(enterStat));

      /*      For an #Id# to enter the basis we better recompute the Test value.
       */
      if(rep() == COLUMN)
      {
         computePvec(enterIdx);
         enterTest = computeTest(enterIdx);
         theTest[enterIdx] = 0;
      }
      else
      {
         enterTest = coTest()[enterIdx];
         theCoTest[enterIdx] = 0;
      }

      switch(enterStat)
      {
      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = enterUB;
         enterMax = enterLB - enterUB;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         objChange -= enterVal * enterRO;

         if(enterLB <= R(-infinity))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_LOWER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = enterLB;
         enterMax = enterUB - enterLB;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         objChange -= enterVal * enterRO;

         if(enterUB >= R(infinity))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_UPPER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = 0;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
         enterMax = (enterRO - enterPric > 0) ? R(infinity) : R(-infinity);
         break;

      // dual/rowwise cases:
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         assert(theUCbound[enterIdx] < R(infinity));
         enterUB = theUCbound[enterIdx];
         enterLB = R(-infinity);
         enterMax = R(-infinity);
         enterVal = enterUB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = SPxLPBase<R>::lower(enterIdx);
         objChange -= enterRO * enterVal;
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         assert(theLCbound[enterIdx] > R(-infinity));
         enterLB = theLCbound[enterIdx];
         enterUB = R(infinity);
         enterMax = R(infinity);
         enterVal = enterLB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = SPxLPBase<R>::upper(enterIdx);
         objChange -= enterRO * enterVal;
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_FREE:
         assert(rep() == ROW);
         assert(SPxLPBase<R>::lower(enterIdx) == SPxLPBase<R>::upper(enterIdx));
         enterUB = R(infinity);
         enterLB = R(-infinity);
         enterVal = 0;
         enterRO = SPxLPBase<R>::upper(enterIdx);
         enterPric = (*theCoPvec)[enterIdx];

         if(enterPric > enterRO)
            enterMax = R(infinity);
         else
            enterMax = R(-infinity);

         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);
         enterPric = (*theCoPvec)[enterIdx];

         if(enterPric > SPxLPBase<R>::upper(enterIdx))
         {
            enterLB = theLCbound[enterIdx];
            enterUB = R(infinity);
            enterMax = R(infinity);
            enterVal = enterLB;
            enterRO = SPxLPBase<R>::upper(enterIdx);
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            enterUB = theUCbound[enterIdx];
            enterVal = enterUB;
            enterRO = SPxLPBase<R>::lower(enterIdx);
            enterLB = R(-infinity);
            enterMax = R(-infinity);
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         objChange -= theLCbound[enterIdx] * SPxLPBase<R>::upper(enterIdx);
         objChange -= theUCbound[enterIdx] * SPxLPBase<R>::lower(enterIdx);
         break;

      default:
         throw SPxInternalCodeException("XENTER01 This should never happen.");
      }

      SPxOut::debug(this, "DENTER03 SPxSolverBase::getEnterVals() : col {}: {} -> {} objChange: {}\n",
                    enterIdx, enterStat, ds.colStatus(enterIdx), objChange);
   }

   else
   {
      assert(enterId.isSPxRowId());
      enterIdx = this->number(SPxRowId(enterId));
      enterStat = ds.rowStatus(enterIdx);
      assert(!isBasic(enterStat));

      /*      For an #Id# to enter the basis we better recompute the Test value.
       */
      if(rep() == ROW)
      {
         computePvec(enterIdx);
         enterTest = computeTest(enterIdx);
         theTest[enterIdx] = 0;
      }
      else
      {
         enterTest = coTest()[enterIdx];
         theCoTest[enterIdx] = 0;
      }

      switch(enterStat)
      {
      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         enterUB = theURbound[enterIdx];
         enterLB = theLRbound[enterIdx];
         enterVal = enterLB;
         enterMax = enterUB - enterLB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         objChange -= enterRO * enterVal;

         if(enterUB >= R(infinity))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_LOWER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         enterUB = theURbound[enterIdx];
         enterLB = theLRbound[enterIdx];
         enterVal = enterUB;
         enterMax = enterLB - enterUB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         objChange -= enterRO * enterVal;

         if(enterLB <= R(-infinity))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_UPPER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XENTER02 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "EENTER99 ERROR: not yet debugged!" << std::endl;)
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
#endif
         break;

      // dual/rowwise cases:
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         assert(theURbound[enterIdx] < R(infinity));
         enterUB = theURbound[enterIdx];
         enterLB = R(-infinity);
         enterVal = enterUB;
         enterMax = R(-infinity);
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->lhs(enterIdx);
         objChange -= enterRO * enterVal;
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         assert(theLRbound[enterIdx] > R(-infinity));
         enterLB = theLRbound[enterIdx];
         enterUB = R(infinity);
         enterVal = enterLB;
         enterMax = R(infinity);
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->rhs(enterIdx);
         objChange -= enterRO * enterVal;
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_FREE:
         assert(rep() == ROW);
         assert(this->rhs(enterIdx) == this->lhs(enterIdx));
         enterUB = R(infinity);
         enterLB = R(-infinity);
         enterVal = 0;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->rhs(enterIdx);
         enterMax = (enterPric > enterRO) ? R(infinity) : R(-infinity);
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);
         enterPric = (*thePvec)[enterIdx];

         if(enterPric > this->rhs(enterIdx))
         {
            enterLB = theLRbound[enterIdx];
            enterVal = enterLB;
            enterUB = R(infinity);
            enterMax = R(infinity);
            enterRO = this->rhs(enterIdx);
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            enterUB = theURbound[enterIdx];
            enterVal = enterUB;
            enterLB = R(-infinity);
            enterMax = R(-infinity);
            enterRO = this->lhs(enterIdx);
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         objChange -= theLRbound[enterIdx] * this->rhs(enterIdx);
         objChange -= theURbound[enterIdx] * this->lhs(enterIdx);
         break;

      default:
         throw SPxInternalCodeException("XENTER03 This should never happen.");
      }

      SPxOut::debug(this, "DENTER05 SPxSolverBase::getEnterVals() : row {}: {} -> {} objChange: {}\n",
                    enterIdx, enterStat, ds.rowStatus(enterIdx), objChange);
   }
}